

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

const_iterator __thiscall VulkanHppGenerator::findFeature(VulkanHppGenerator *this,string *name)

{
  FeatureData *pFVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  FeatureData *pFVar3;
  
  pFVar3 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar3 != pFVar1) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    do {
      if ((pFVar3->name)._M_string_length == __n) {
        if (__n == 0) {
          return (const_iterator)pFVar3;
        }
        iVar2 = bcmp((pFVar3->name)._M_dataplus._M_p,__s2,__n);
        if (iVar2 == 0) {
          return (const_iterator)pFVar3;
        }
      }
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != pFVar1);
  }
  return (const_iterator)pFVar3;
}

Assistant:

std::vector<VulkanHppGenerator::FeatureData>::const_iterator VulkanHppGenerator::findFeature( std::string const & name ) const
{
  return std::ranges::find_if( m_features, [&name]( FeatureData const & fd ) { return fd.name == name; } );
}